

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

void __thiscall leveldb::DBImpl::ReleaseSnapshot(DBImpl *this,Snapshot *snapshot)

{
  MutexLock local_20;
  MutexLock l;
  Snapshot *snapshot_local;
  DBImpl *this_local;
  
  l.mu_ = (Mutex *)snapshot;
  MutexLock::MutexLock(&local_20,&this->mutex_);
  SnapshotList::Delete(&this->snapshots_,(SnapshotImpl *)l.mu_);
  MutexLock::~MutexLock(&local_20);
  return;
}

Assistant:

void DBImpl::ReleaseSnapshot(const Snapshot* snapshot) {
  MutexLock l(&mutex_);
  snapshots_.Delete(static_cast<const SnapshotImpl*>(snapshot));
}